

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.cpp
# Opt level: O3

void __thiscall duckdb::ProgressBar::FinishProgressBarPrint(ProgressBar *this)

{
  pointer pPVar1;
  
  if (this->finished == false) {
    pPVar1 = unique_ptr<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>,_true>
             ::operator->(&this->display);
    (*pPVar1->_vptr_ProgressBarDisplay[3])(pPVar1);
    this->finished = true;
    if (ABS((this->query_progress).percentage._M_i) == 0.0) {
      LOCK();
      (this->query_progress).percentage._M_i = -1.0;
      UNLOCK();
      LOCK();
      (this->query_progress).rows_processed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (this->query_progress).total_rows_to_process.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void ProgressBar::FinishProgressBarPrint() {
	if (finished) {
		return;
	}
	D_ASSERT(display);
	display->Finish();
	finished = true;
	if (query_progress.percentage == 0) {
		query_progress.Initialize();
	}
}